

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# facenet.cpp
# Opt level: O2

void __thiscall
facenet::Inception_resnet_A(facenet *this,pBox *input,pBox *output,string *filepath,float scale)

{
  pBox *pbox;
  pBox *pbox_00;
  pBox *pbox_01;
  pBox *pbox_02;
  pBox *pbox_03;
  pBox *pbox_04;
  pBox *pbox_05;
  pBox *pbox_06;
  Weight *weight;
  Weight *weight_00;
  Weight *weight_01;
  Weight *weight_02;
  Weight *weight_03;
  Weight *weight_04;
  Weight *weight_05;
  Weight *weight_06;
  BN *bn;
  BN *bn_00;
  BN *bn_01;
  BN *bn_02;
  BN *bn_03;
  BN *bn_04;
  BN *bn_05;
  BN *bn_06;
  BN *bn_07;
  BN *bn_08;
  BN *bn_09;
  BN *bn_10;
  BN *bn_11;
  BN *bn_12;
  BN *bn_13;
  BN *bn_14;
  BN *bn_15;
  BN *bn_16;
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  string local_218;
  mydataFmt *local_1f8;
  mydataFmt *local_1f0;
  mydataFmt *local_1e8;
  mydataFmt *local_1e0;
  mydataFmt *local_1d8;
  mydataFmt *local_1d0;
  mydataFmt *local_1c8;
  mydataFmt *local_1c0;
  mydataFmt *local_1b8;
  mydataFmt *local_1b0;
  mydataFmt *local_1a8;
  mydataFmt *local_1a0;
  mydataFmt *local_198;
  mydataFmt *local_190;
  mydataFmt *local_188;
  mydataFmt *local_180;
  mydataFmt *local_178;
  mydataFmt *local_170;
  mydataFmt *local_168;
  mydataFmt *local_160;
  mydataFmt *local_158;
  mydataFmt *local_150;
  mydataFmt *local_148;
  mydataFmt *local_140;
  mydataFmt *local_138;
  mydataFmt *pmStack_130;
  mydataFmt *local_128;
  mydataFmt *pmStack_120;
  long dataNumber [28];
  
  pbox = (pBox *)operator_new(0x38);
  (pbox->super_String)._M_dataplus._M_p = (pointer)&(pbox->super_String).field_2;
  (pbox->super_String)._M_string_length = 0;
  (pbox->super_String).field_2._M_local_buf[0] = '\0';
  pbox_00 = (pBox *)operator_new(0x38);
  (pbox_00->super_String)._M_dataplus._M_p = (pointer)&(pbox_00->super_String).field_2;
  (pbox_00->super_String)._M_string_length = 0;
  (pbox_00->super_String).field_2._M_local_buf[0] = '\0';
  pbox_01 = (pBox *)operator_new(0x38);
  (pbox_01->super_String)._M_dataplus._M_p = (pointer)&(pbox_01->super_String).field_2;
  (pbox_01->super_String)._M_string_length = 0;
  (pbox_01->super_String).field_2._M_local_buf[0] = '\0';
  pbox_02 = (pBox *)operator_new(0x38);
  (pbox_02->super_String)._M_dataplus._M_p = (pointer)&(pbox_02->super_String).field_2;
  (pbox_02->super_String)._M_string_length = 0;
  (pbox_02->super_String).field_2._M_local_buf[0] = '\0';
  pbox_03 = (pBox *)operator_new(0x38);
  (pbox_03->super_String)._M_dataplus._M_p = (pointer)&(pbox_03->super_String).field_2;
  (pbox_03->super_String)._M_string_length = 0;
  (pbox_03->super_String).field_2._M_local_buf[0] = '\0';
  pbox_04 = (pBox *)operator_new(0x38);
  (pbox_04->super_String)._M_dataplus._M_p = (pointer)&(pbox_04->super_String).field_2;
  (pbox_04->super_String)._M_string_length = 0;
  (pbox_04->super_String).field_2._M_local_buf[0] = '\0';
  pbox_05 = (pBox *)operator_new(0x38);
  (pbox_05->super_String)._M_dataplus._M_p = (pointer)&(pbox_05->super_String).field_2;
  (pbox_05->super_String)._M_string_length = 0;
  (pbox_05->super_String).field_2._M_local_buf[0] = '\0';
  pbox_06 = (pBox *)operator_new(0x38);
  (pbox_06->super_String)._M_dataplus._M_p = (pointer)&(pbox_06->super_String).field_2;
  (pbox_06->super_String)._M_string_length = 0;
  (pbox_06->super_String).field_2._M_local_buf[0] = '\0';
  weight = (Weight *)operator_new(0x38);
  weight_00 = (Weight *)operator_new(0x38);
  weight_01 = (Weight *)operator_new(0x38);
  weight_02 = (Weight *)operator_new(0x38);
  weight_03 = (Weight *)operator_new(0x38);
  weight_04 = (Weight *)operator_new(0x38);
  weight_05 = (Weight *)operator_new(0x38);
  weight_06 = (Weight *)operator_new(0x38);
  bn = (BN *)operator_new(0x10);
  bn_00 = (BN *)operator_new(0x10);
  bn_01 = (BN *)operator_new(0x10);
  bn_02 = (BN *)operator_new(0x10);
  bn_03 = (BN *)operator_new(0x10);
  bn_04 = (BN *)operator_new(0x10);
  bn_05 = (BN *)operator_new(0x10);
  bn_06 = (BN *)operator_new(0x10);
  bn_07 = (BN *)operator_new(0x10);
  bn_08 = (BN *)operator_new(0x10);
  bn_09 = (BN *)operator_new(0x10);
  bn_10 = (BN *)operator_new(0x10);
  bn_11 = (BN *)operator_new(0x10);
  bn_12 = (BN *)operator_new(0x10);
  bn_13 = (BN *)operator_new(0x10);
  bn_14 = (BN *)operator_new(0x10);
  bn_15 = (BN *)operator_new(0x10);
  bn_16 = (BN *)operator_new(0x10);
  lVar1 = ConvAndFcInit(weight,0x20,0x100,1,1,0,0,0,0,0);
  BatchNormInit(bn_01,bn_00,bn,0x20);
  lVar2 = ConvAndFcInit(weight_00,0x20,0x100,1,1,0,0,0,0,0);
  BatchNormInit(bn_04,bn_03,bn_02,0x20);
  lVar3 = ConvAndFcInit(weight_01,0x20,0x20,3,1,1,0,0,0,0);
  BatchNormInit(bn_07,bn_06,bn_05,0x20);
  lVar4 = ConvAndFcInit(weight_02,0x20,0x100,1,1,0,0,0,0,0);
  BatchNormInit(bn_10,bn_09,bn_08,0x20);
  lVar5 = ConvAndFcInit(weight_03,0x20,0x20,3,1,1,0,0,0,0);
  BatchNormInit(bn_13,bn_12,bn_11,0x20);
  lVar6 = ConvAndFcInit(weight_04,0x20,0x20,3,1,1,0,0,0,0);
  BatchNormInit(bn_16,bn_15,bn_14,0x20);
  lVar7 = ConvAndFcInit(weight_05,0x100,0x60,1,1,0,0,0,0,0);
  dataNumber[0x1a] = ConvAndFcInit(weight_06,0x100,0,0,0,0,0,0,0,0);
  dataNumber[1] = 0x20;
  dataNumber[2] = 0x20;
  dataNumber[3] = 0x20;
  dataNumber[5] = 0x20;
  dataNumber[6] = 0x20;
  dataNumber[7] = 0x20;
  dataNumber[9] = 0x20;
  dataNumber[10] = 0x20;
  dataNumber[0xb] = 0x20;
  dataNumber[0xd] = 0x20;
  dataNumber[0xe] = 0x20;
  dataNumber[0xf] = 0x20;
  dataNumber[0x11] = 0x20;
  dataNumber[0x12] = 0x20;
  dataNumber[0x13] = 0x20;
  dataNumber[0x15] = 0x20;
  dataNumber[0x16] = 0x20;
  dataNumber[0x17] = 0x20;
  dataNumber[0x19] = 0x100;
  local_1f8 = weight->pdata;
  local_1f0 = bn_01->pdata;
  local_1e8 = bn_00->pdata;
  local_1e0 = bn->pdata;
  local_1d8 = weight_00->pdata;
  local_1d0 = bn_04->pdata;
  local_1c8 = bn_03->pdata;
  local_1c0 = bn_02->pdata;
  local_1b8 = weight_01->pdata;
  local_1b0 = bn_07->pdata;
  local_1a8 = bn_06->pdata;
  local_1a0 = bn_05->pdata;
  local_198 = weight_02->pdata;
  local_190 = bn_10->pdata;
  local_188 = bn_09->pdata;
  local_180 = bn_08->pdata;
  local_178 = weight_03->pdata;
  local_170 = bn_13->pdata;
  local_168 = bn_12->pdata;
  local_160 = bn_11->pdata;
  local_158 = weight_04->pdata;
  local_150 = bn_16->pdata;
  local_148 = bn_15->pdata;
  local_140 = bn_14->pdata;
  dataNumber[0x1b] = 0;
  local_138 = weight_05->pdata;
  pmStack_130 = weight_05->pbias;
  local_128 = weight_06->pdata;
  pmStack_120 = weight_06->pbias;
  dataNumber[0] = lVar1;
  dataNumber[4] = lVar2;
  dataNumber[8] = lVar3;
  dataNumber[0xc] = lVar4;
  dataNumber[0x10] = lVar5;
  dataNumber[0x14] = lVar6;
  dataNumber[0x18] = lVar7;
  std::__cxx11::string::string((string *)&local_218,(string *)filepath);
  readData(&local_218,dataNumber,&local_1f8,0x1c);
  std::__cxx11::string::~string((string *)&local_218);
  convolutionInit(weight,input,pbox);
  convolution(weight,input,pbox);
  BatchNorm(pbox,bn_01,bn_00,bn);
  relu(pbox,weight->pbias);
  convolutionInit(weight_00,input,pbox_00);
  convolution(weight_00,input,pbox_00);
  BatchNorm(pbox_00,bn_04,bn_03,bn_02);
  relu(pbox_00,weight_00->pbias);
  convolutionInit(weight_01,pbox_00,pbox_01);
  convolution(weight_01,pbox_00,pbox_01);
  BatchNorm(pbox_01,bn_07,bn_06,bn_05);
  relu(pbox_01,weight_01->pbias);
  convolutionInit(weight_02,input,pbox_02);
  convolution(weight_02,input,pbox_02);
  BatchNorm(pbox_02,bn_10,bn_09,bn_08);
  relu(pbox_02,weight_02->pbias);
  convolutionInit(weight_03,pbox_02,pbox_03);
  convolution(weight_03,pbox_02,pbox_03);
  BatchNorm(pbox_03,bn_13,bn_12,bn_11);
  relu(pbox_03,weight_03->pbias);
  convolutionInit(weight_04,pbox_03,pbox_04);
  convolution(weight_04,pbox_03,pbox_04);
  BatchNorm(pbox_04,bn_16,bn_15,bn_14);
  relu(pbox_04,weight_04->pbias);
  conv_mergeInit(pbox_05,pbox,pbox_01,pbox_04,(pBox *)0x0);
  conv_merge(pbox_05,pbox,pbox_01,pbox_04,(pBox *)0x0);
  convolutionInit(weight_05,pbox_05,pbox_06);
  convolution(weight_05,pbox_05,pbox_06);
  addbias(pbox_06,weight_05->pbias);
  mulandaddInit(input,pbox_06,output);
  mulandadd(input,pbox_06,output,scale);
  relu(output,weight_06->pbias);
  freepBox(pbox);
  freepBox(pbox_00);
  freepBox(pbox_01);
  freepBox(pbox_02);
  freepBox(pbox_03);
  freepBox(pbox_04);
  freepBox(pbox_05);
  freepBox(pbox_06);
  freeWeight(weight);
  freeWeight(weight_00);
  freeWeight(weight_01);
  freeWeight(weight_02);
  freeWeight(weight_03);
  freeWeight(weight_04);
  freeWeight(weight_05);
  freeWeight(weight_06);
  freeBN(bn);
  freeBN(bn_00);
  freeBN(bn_01);
  freeBN(bn_02);
  freeBN(bn_03);
  freeBN(bn_04);
  freeBN(bn_05);
  freeBN(bn_06);
  freeBN(bn_07);
  freeBN(bn_08);
  freeBN(bn_09);
  freeBN(bn_10);
  freeBN(bn_11);
  freeBN(bn_12);
  freeBN(bn_13);
  freeBN(bn_14);
  freeBN(bn_15);
  freeBN(bn_16);
  return;
}

Assistant:

void facenet::Inception_resnet_A(pBox *input, pBox *output, string filepath, float scale) {
    pBox *conv1_out = new pBox;
    pBox *conv2_out = new pBox;
    pBox *conv3_out = new pBox;
    pBox *conv4_out = new pBox;
    pBox *conv5_out = new pBox;
    pBox *conv6_out = new pBox;
    pBox *conv7_out = new pBox;
    pBox *conv8_out = new pBox;

    struct Weight *conv1_wb = new Weight;
    struct Weight *conv2_wb = new Weight;
    struct Weight *conv3_wb = new Weight;
    struct Weight *conv4_wb = new Weight;
    struct Weight *conv5_wb = new Weight;
    struct Weight *conv6_wb = new Weight;
    struct Weight *conv7_wb = new Weight;
    struct Weight *conv8_wb = new Weight;

    struct BN *conv1_var = new BN;
    struct BN *conv1_mean = new BN;
    struct BN *conv1_beta = new BN;

    struct BN *conv2_var = new BN;
    struct BN *conv2_mean = new BN;
    struct BN *conv2_beta = new BN;

    struct BN *conv3_var = new BN;
    struct BN *conv3_mean = new BN;
    struct BN *conv3_beta = new BN;

    struct BN *conv4_var = new BN;
    struct BN *conv4_mean = new BN;
    struct BN *conv4_beta = new BN;

    struct BN *conv5_var = new BN;
    struct BN *conv5_mean = new BN;
    struct BN *conv5_beta = new BN;

    struct BN *conv6_var = new BN;
    struct BN *conv6_mean = new BN;
    struct BN *conv6_beta = new BN;


    long conv1 = ConvAndFcInit(conv1_wb, 32, 256, 1, 1, 0);
    BatchNormInit(conv1_beta, conv1_mean, conv1_var, 32);

    long conv2 = ConvAndFcInit(conv2_wb, 32, 256, 1, 1, 0);
    BatchNormInit(conv2_beta, conv2_mean, conv2_var, 32);
    long conv3 = ConvAndFcInit(conv3_wb, 32, 32, 3, 1, 1);
    BatchNormInit(conv3_beta, conv3_mean, conv3_var, 32);

    long conv4 = ConvAndFcInit(conv4_wb, 32, 256, 1, 1, 0);
    BatchNormInit(conv4_beta, conv4_mean, conv4_var, 32);
    long conv5 = ConvAndFcInit(conv5_wb, 32, 32, 3, 1, 1);
    BatchNormInit(conv5_beta, conv5_mean, conv5_var, 32);
    long conv6 = ConvAndFcInit(conv6_wb, 32, 32, 3, 1, 1);
    BatchNormInit(conv6_beta, conv6_mean, conv6_var, 32);

    long conv7 = ConvAndFcInit(conv7_wb, 256, 96, 1, 1, 0);

    long conv8 = ConvAndFcInit(conv8_wb, 256, 0, 0, 0, 0);

    long dataNumber[28] = {conv1, 32, 32, 32, conv2, 32, 32, 32, conv3, 32, 32, 32, conv4, 32, 32, 32,
                           conv5, 32, 32, 32, conv6, 32, 32, 32, conv7, 256, conv8, 0};

//    mydataFmt *pointTeam[28] = {
//                            conv1_wb->pdata, conv1_var->pdata, conv1_mean->pdata, conv1_beta->pdata, \
//                            conv2_wb->pdata, conv2_var->pdata, conv2_mean->pdata, conv2_beta->pdata, \
//                            conv3_wb->pdata, conv3_var->pdata, conv3_mean->pdata, conv3_beta->pdata, \
//                            conv4_wb->pdata, conv4_var->pdata, conv4_mean->pdata, conv4_beta->pdata, \
//                            conv5_wb->pdata, conv5_var->pdata, conv5_mean->pdata, conv5_beta->pdata, \
//                            conv6_wb->pdata, conv6_var->pdata, conv6_mean->pdata, conv6_beta->pdata, \
//                            conv7_wb->pdata, conv7_wb->pbias, \
//                            conv8_wb->pdata, conv8_wb->pbias};
    mydataFmt *pointTeam[28] = {
                            conv1_wb->pdata, conv1_beta->pdata, conv1_mean->pdata, conv1_var->pdata, \
                            conv2_wb->pdata, conv2_beta->pdata, conv2_mean->pdata, conv2_var->pdata, \
                            conv3_wb->pdata, conv3_beta->pdata, conv3_mean->pdata, conv3_var->pdata, \
                            conv4_wb->pdata, conv4_beta->pdata, conv4_mean->pdata, conv4_var->pdata, \
                            conv5_wb->pdata, conv5_beta->pdata, conv5_mean->pdata, conv5_var->pdata, \
                            conv6_wb->pdata, conv6_beta->pdata, conv6_mean->pdata, conv6_var->pdata, \
                            conv7_wb->pdata, conv7_wb->pbias, \
                            conv8_wb->pdata, conv8_wb->pbias};

    readData(filepath, dataNumber, pointTeam, 28);

    convolutionInit(conv1_wb, input, conv1_out);
    //conv1 35 x 35 x 32
    convolution(conv1_wb, input, conv1_out);
    BatchNorm(conv1_out, conv1_beta, conv1_mean, conv1_var);
    relu(conv1_out, conv1_wb->pbias);

    convolutionInit(conv2_wb, input, conv2_out);
    //conv2 35 x 35 x 32
    convolution(conv2_wb, input, conv2_out);
    BatchNorm(conv2_out, conv2_beta, conv2_mean, conv2_var);
    relu(conv2_out, conv2_wb->pbias);
    convolutionInit(conv3_wb, conv2_out, conv3_out);
    //conv3 35 x 35 x 32
    convolution(conv3_wb, conv2_out, conv3_out);
    BatchNorm(conv3_out, conv3_beta, conv3_mean, conv3_var);
    relu(conv3_out, conv3_wb->pbias);

    convolutionInit(conv4_wb, input, conv4_out);
    //conv4 35 x 35 x 32
    convolution(conv4_wb, input, conv4_out);
    BatchNorm(conv4_out, conv4_beta, conv4_mean, conv4_var);
    relu(conv4_out, conv4_wb->pbias);
    convolutionInit(conv5_wb, conv4_out, conv5_out);
    //conv5 35 x 35 x 32
    convolution(conv5_wb, conv4_out, conv5_out);
    BatchNorm(conv5_out, conv5_beta, conv5_mean, conv5_var);
    relu(conv5_out, conv5_wb->pbias);
    convolutionInit(conv6_wb, conv5_out, conv6_out);
    //conv6 35 x 35 x 32
    convolution(conv6_wb, conv5_out, conv6_out);
    BatchNorm(conv6_out, conv6_beta, conv6_mean, conv6_var);
    relu(conv6_out, conv6_wb->pbias);

    conv_mergeInit(conv7_out, conv1_out, conv3_out, conv6_out);
    //35 × 35 × 96
    conv_merge(conv7_out, conv1_out, conv3_out, conv6_out);

    convolutionInit(conv7_wb, conv7_out, conv8_out);
    //35*35*256
    convolution(conv7_wb, conv7_out, conv8_out);
    addbias(conv8_out, conv7_wb->pbias);

    mulandaddInit(input, conv8_out, output);
    mulandadd(input, conv8_out, output, scale);
    relu(output, conv8_wb->pbias);

    freepBox(conv1_out);
    freepBox(conv2_out);
    freepBox(conv3_out);
    freepBox(conv4_out);
    freepBox(conv5_out);
    freepBox(conv6_out);
    freepBox(conv7_out);
    freepBox(conv8_out);

    freeWeight(conv1_wb);
    freeWeight(conv2_wb);
    freeWeight(conv3_wb);
    freeWeight(conv4_wb);
    freeWeight(conv5_wb);
    freeWeight(conv6_wb);
    freeWeight(conv7_wb);
    freeWeight(conv8_wb);

    freeBN(conv1_var);
    freeBN(conv1_mean);
    freeBN(conv1_beta);

    freeBN(conv2_var);
    freeBN(conv2_mean);
    freeBN(conv2_beta);

    freeBN(conv3_var);
    freeBN(conv3_mean);
    freeBN(conv3_beta);

    freeBN(conv4_var);
    freeBN(conv4_mean);
    freeBN(conv4_beta);

    freeBN(conv5_var);
    freeBN(conv5_mean);
    freeBN(conv5_beta);

    freeBN(conv6_var);
    freeBN(conv6_mean);
    freeBN(conv6_beta);
}